

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void iutest::detail::
     TypeParameterizedTestSuite<TypeParamTest,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Test>,_iutest::detail::VariadicTypeList<float>_>
     ::
     EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Test>_>
     ::Register(TestSuite *testsuite,char *test_names)

{
  char *in_RAX;
  char *extraout_RAX;
  char *__s;
  char *pcVar1;
  EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Test>_>
  *this;
  iuPool *this_00;
  char *p;
  string local_1c8;
  string test_name;
  
  if (test_names == (char *)0x0) {
    IUTestLog::IUTestLog
              ((IUTestLog *)&test_name,LOG_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
               ,0x1f9);
    std::operator<<((ostream *)((long)&test_name.field_2 + 8),
                    "Condition test_names != NULL failed. ");
    IUTestLog::~IUTestLog((IUTestLog *)&test_name);
    in_RAX = extraout_RAX;
  }
  __s = SkipSpace(in_RAX);
  pcVar1 = strchr(__s,0x2c);
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::assign((char *)&test_name);
  }
  else {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,__s,pcVar1);
    std::__cxx11::string::operator=((string *)&test_name,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  this = (EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Test>_>
          *)operator_new(0xd8);
  StripTrailingSpace(&local_1c8,&test_name);
  EachTest(this,testsuite,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  this_00 = iuPool::GetInstance();
  iuPool::push(this_00,(value_ptr)this);
  SkipSpace(p);
  std::__cxx11::string::~string((string *)&test_name);
  return;
}

Assistant:

static void Register(TestSuite* testsuite, const char* test_names)
        {
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
            IUTEST_CHECK_(test_names != NULL);
            const char* str = detail::SkipSpace(test_names);
            const char* comma = strchr(str, ',');
            ::std::string test_name;
            if( comma == NULL )
            {
                test_name = str;
            }
            else
            {
                test_name = ::std::string(str, static_cast<size_t>(comma - str));
                ++comma;
            }
            _Myt* test = new EachTest(testsuite, StripTrailingSpace(test_name));
            // new オブジェクトを管理してもらう
            detail::iuPool::GetInstance().push(test);

            EachTest<TypeParam, typename TestsList::Tail>::Register(testsuite, detail::SkipSpace(comma));
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
        }